

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

json * __thiscall argo::json::operator[](json *this,string *name)

{
  const_iterator cVar1;
  json_exception *this_00;
  char *json_type_name;
  json_invalid_key_exception *this_01;
  
  if (this->m_type != object_e) {
    this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
    json_type_name = get_instance_type_name(this);
    json_exception::json_exception(this_00,not_an_object_e,json_type_name);
    __cxa_throw(this_00,&json_exception::typeinfo,std::exception::~exception);
  }
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
          ::find(&(this->m_value).u_object._M_t,name);
  if (cVar1._M_node != (_Base_ptr)((long)&this->m_value + 8)) {
    return *(json **)(cVar1._M_node + 2);
  }
  this_01 = (json_invalid_key_exception *)__cxa_allocate_exception(0xd8);
  json_invalid_key_exception::json_invalid_key_exception(this_01,invalid_key_e,name);
  __cxa_throw(this_01,&json_invalid_key_exception::typeinfo,std::exception::~exception);
}

Assistant:

const json &json::operator[](const string &name) const
{
    if (m_type == object_e)
    {
        auto i = m_value.u_object.find(name);
        if (i == m_value.u_object.end())
        {
            throw json_invalid_key_exception(json_exception::invalid_key_e, name);
        }
        else
        {
            return *(i->second);
        }
    }
    else
    {
        throw json_exception(json_exception::not_an_object_e, get_instance_type_name());
    }
}